

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  bool bVar1;
  Struct *pSVar2;
  StructValues<wasm::LUBFinder> *this_00;
  LUBFinder *pLVar3;
  Type TVar4;
  uint uVar5;
  ulong index;
  HeapType local_40;
  HeapType oldStructType_local;
  Type oldType;
  
  local_40.id = oldStructType.id;
  pSVar2 = HeapType::getStruct(&local_40);
  for (uVar5 = 0; index = (ulong)uVar5,
      index < (ulong)((long)(struct_->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(struct_->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
    oldStructType_local.id =
         (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start[index].type.id;
    bVar1 = wasm::Type::isRef((Type *)&oldStructType_local);
    if (bVar1) {
      this_00 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                          ((StructValuesMap<wasm::LUBFinder> *)(*(long *)((long)this + 0x68) + 0x30)
                           ,local_40);
      pLVar3 = StructUtils::StructValues<wasm::LUBFinder>::operator[](this_00,index);
      TVar4 = GlobalTypeRewriter::getTempType((GlobalTypeRewriter *)this,(pLVar3->lub).id);
      (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start[index].type.id = TVar4.id;
    }
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        const auto& oldFields = oldStructType.getStruct().fields;
        auto& newFields = struct_.fields;

        for (Index i = 0; i < newFields.size(); i++) {
          auto oldType = oldFields[i].type;
          if (!oldType.isRef()) {
            continue;
          }
          auto newType = parent.finalInfos[oldStructType][i].getLUB();
          newFields[i].type = getTempType(newType);
        }
      }